

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O3

void __thiscall cmGlobalGenerator::ComputeBuildFileGenerators(cmGlobalGenerator *this)

{
  ulong uVar1;
  pointer ppcVar2;
  vector<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_> gens;
  vector<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_> local_38;
  
  if ((this->LocalGenerators).
      super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->LocalGenerators).
      super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar1 = 0;
    do {
      cmMakefile::GetExportBuildFileGenerators
                (&local_38,
                 (this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar1]);
      ppcVar2 = local_38.
                super__Vector_base<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (local_38.
          super__Vector_base<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_38.
          super__Vector_base<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          cmExportBuildFileGenerator::Compute
                    (*ppcVar2,(this->LocalGenerators).
                              super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar1]);
          ppcVar2 = ppcVar2 + 1;
        } while (ppcVar2 !=
                 local_38.
                 super__Vector_base<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      if (local_38.
          super__Vector_base<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_38.
                        super__Vector_base<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_38.
                              super__Vector_base<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_38.
                              super__Vector_base<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      uVar1 = (ulong)((int)uVar1 + 1);
    } while (uVar1 < (ulong)((long)(this->LocalGenerators).
                                   super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->LocalGenerators).
                                   super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  return;
}

Assistant:

std::string cmGlobalGenerator::GetLanguageFromExtension(const char* ext) const
{
  // if there is an extension and it starts with . then move past the
  // . because the extensions are not stored with a .  in the map
  if (ext && *ext == '.') {
    ++ext;
  }
  std::map<std::string, std::string>::const_iterator it =
    this->ExtensionToLanguage.find(ext);
  if (it != this->ExtensionToLanguage.end()) {
    return it->second;
  }
  return "";
}